

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable_locks.c
# Opt level: O2

void * add_records(add_records_args *args)

{
  long lVar1;
  int iVar2;
  spki_record *spki_record;
  rtr_socket *socket;
  int ASN;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  socket = (rtr_socket *)(ulong)(uint)(args->count + -1 + args->start_asn);
  printf("Add %i records: ASN [%i..%i]\n");
  iVar2 = args->start_asn;
  ASN = iVar2;
  while( true ) {
    if (iVar2 + args->count <= ASN) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (void *)0x0;
      }
      __stack_chk_fail();
    }
    spki_record = create_record(ASN,ASN,ASN,socket);
    iVar2 = spki_table_add_entry(args->table,spki_record);
    if (iVar2 != 0) break;
    free(spki_record);
    ASN = ASN + 1;
    iVar2 = args->start_asn;
  }
  __assert_fail("ret == SPKI_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable_locks.c"
                ,0x54,"void *add_records(struct add_records_args *)");
}

Assistant:

static void *add_records(struct add_records_args *args)
{
	printf("Add %i records: ASN [%i..%i]\n", args->count, args->start_asn, args->count + args->start_asn - 1);
	for (int i = args->start_asn; i < args->count + args->start_asn; i++) {
		struct spki_record *record = create_record(i, i, i, NULL);
		int ret = spki_table_add_entry(args->table, record);

		assert(ret == SPKI_SUCCESS);
		free(record);
	}

	return NULL;
}